

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::LoadStoreMachine::GenLoadShader<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<int,_4> *expected_value)

{
  ostream *poVar1;
  undefined4 in_register_0000000c;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  int iVar2;
  char *pcVar3;
  ShaderImageLoadStoreBase *pSVar4;
  ostringstream os;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::operator<<(&local_1a0,"\n#define KSIZE 100");
  iVar2 = (int)this;
  if (iVar2 == 4) {
    std::operator<<(&local_1a0,"\nlayout(local_size_x = KSIZE) in;");
  }
  poVar1 = std::operator<<(&local_1a0,"\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a0,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  pcVar3 = ", binding = 3) readonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 3) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_260,(ShaderImageLoadStoreBase *)pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_280,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  pcVar3 = ", binding = 2) readonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 2) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_1c0,(ShaderImageLoadStoreBase *)pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1e0,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  pcVar3 = ", binding = 1) readonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 1) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_200,(ShaderImageLoadStoreBase *)pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_220,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  pcVar3 = ", binding = 0) readonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 0) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_240,(ShaderImageLoadStoreBase *)pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  std::operator<<(poVar1,
                  "image2DArray g_image_2darray;\nlayout(std430) buffer out_data {\n  ivec4 o_color[KSIZE];\n};\nvoid main() {"
                 );
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_2a0);
  if (iVar2 == 0) {
    pSVar4 = (ShaderImageLoadStoreBase *)0x1677287;
    poVar1 = std::operator<<(&local_1a0,"\n  ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_2a0,pSVar4);
    poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
    pcVar3 = "vec4 g_value = ";
    poVar1 = std::operator<<(poVar1,"vec4 g_value = ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_260,(ShaderImageLoadStoreBase *)pcVar3);
    poVar1 = std::operator<<(poVar1,(string *)&local_260);
    pcVar3 = "vec4(o_color[gl_VertexID]) + ";
    poVar1 = std::operator<<(poVar1,"vec4(o_color[gl_VertexID]) + ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_280,(ShaderImageLoadStoreBase *)pcVar3);
    poVar1 = std::operator<<(poVar1,(string *)&local_280);
    poVar1 = std::operator<<(poVar1,"vec4");
    poVar1 = tcu::operator<<(poVar1,(Vector<int,_4> *)CONCAT44(in_register_0000000c,internalformat))
    ;
    std::operator<<(poVar1,";");
  }
  else {
    if (iVar2 != 4) goto LAB_00c64b7e;
    pSVar4 = (ShaderImageLoadStoreBase *)0x1677287;
    poVar1 = std::operator<<(&local_1a0,"\n  ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_2a0,pSVar4);
    poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
    pcVar3 = "vec4 g_value = ";
    poVar1 = std::operator<<(poVar1,"vec4 g_value = ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_260,(ShaderImageLoadStoreBase *)pcVar3);
    poVar1 = std::operator<<(poVar1,(string *)&local_260);
    pcVar3 = "vec4(o_color[gl_GlobalInvocationID.x]) + ";
    poVar1 = std::operator<<(poVar1,"vec4(o_color[gl_GlobalInvocationID.x]) + ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_280,(ShaderImageLoadStoreBase *)pcVar3);
    poVar1 = std::operator<<(poVar1,(string *)&local_280);
    poVar1 = std::operator<<(poVar1,"vec4");
    poVar1 = tcu::operator<<(poVar1,(Vector<int,_4> *)CONCAT44(in_register_0000000c,internalformat))
    ;
    std::operator<<(poVar1,";");
  }
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_2a0);
LAB_00c64b7e:
  std::operator<<(&local_1a0,
                  "\n  int g_index[6] = int[](o_color[0].x, o_color[0].y, o_color[0].z, o_color[0].w, o_color[1].r, o_color[1].g);"
                 );
  if (((ulong)this & 0xfffffffb) == 0) {
    pcVar3 = "\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
    if (iVar2 == 0) {
      pcVar3 = "\n  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
    }
    std::operator<<(&local_1a0,pcVar3);
  }
  pcVar3 = "\n  vec4 r = vec4(0.0, 1.0, 0.0, 1.0);\n  ";
  poVar1 = std::operator<<(&local_1a0,"\n  vec4 r = vec4(0.0, 1.0, 0.0, 1.0);\n  ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_2a0,(ShaderImageLoadStoreBase *)pcVar3);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  std::operator<<(poVar1,
                  "vec4 v;\n  v = imageLoad(g_image_2d, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 2.0);\n  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 3.0);\n  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 6.0);\n  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 23.0);\n  o_color[coord.x] = ivec4(r);\n}"
                 );
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenLoadShader(int stage, GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 100";
		if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = KSIZE) in;";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 3) readonly uniform "
		   << TypePrefix<T>() << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 2) readonly uniform " << TypePrefix<T>() << "image3D g_image_3d;" NL "layout("
		   << FormatEnumToString(internalformat) << ", binding = 1) readonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 0) readonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color[KSIZE];" NL
			  "};" NL "void main() {";

		if (stage == 0)
		{ // VS
			os << NL "  " << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4(o_color[gl_VertexID]) + "
			   << TypePrefix<T>() << "vec4" << expected_value << ";";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  " << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>()
			   << "vec4(o_color[gl_GlobalInvocationID.x]) + " << TypePrefix<T>() << "vec4" << expected_value << ";";
		}

		os << NL "  int g_index[6] = int[](o_color[0].x, o_color[0].y, o_color[0].z, o_color[0].w, o_color[1].r, "
				 "o_color[1].g);";
		if (stage == 0)
		{ // VS
			os << NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  vec4 r = vec4(0.0, 1.0, 0.0, 1.0);" NL "  " << TypePrefix<T>()
		   << "vec4 v;" NL "  v = imageLoad(g_image_2d, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 2.0);" NL
			  "  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 3.0);" NL
			  "  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 6.0);" NL
			  "  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 23.0);" NL "  o_color[coord.x] = ivec4(r);" NL
			  "}";
		return os.str();
	}